

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlc.c
# Opt level: O2

SXML_CHAR * strip_spaces(SXML_CHAR *str,SXML_CHAR repl_sq)

{
  char cVar1;
  uint uVar2;
  ushort **ppuVar3;
  size_t sVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  char *pcVar9;
  char *pcVar10;
  
  lVar7 = 0;
  while ((cVar1 = str[lVar7], 0 < (long)cVar1 &&
         (ppuVar3 = __ctype_b_loc(), (*(byte *)((long)*ppuVar3 + (long)cVar1 * 2 + 1) & 0x20) != 0))
        ) {
    lVar7 = lVar7 + 1;
  }
  sVar4 = strlen(str);
  uVar2 = (uint)sVar4;
  uVar8 = sVar4 & 0xffffffff;
  pcVar10 = str + lVar7;
  do {
    uVar6 = (uint)uVar8;
    uVar5 = ((int)uVar2 >> 0x1f & uVar2) - 1;
    if ((int)uVar6 < 1) goto LAB_00105aed;
    uVar8 = uVar8 - 1;
    cVar1 = str[uVar8 & 0xffffffff];
  } while ((-1 < (long)cVar1) &&
          (ppuVar3 = __ctype_b_loc(), (*(byte *)((long)*ppuVar3 + (long)cVar1 * 2 + 1) & 0x20) != 0)
          );
  uVar5 = uVar6 - 1;
  if (cVar1 == '\\') {
    uVar5 = uVar6;
  }
LAB_00105aed:
  str[(long)(int)uVar5 + 1] = '\0';
  if (repl_sq == '\0') {
    pcVar9 = str;
    if ((lVar7 != 0) || (uVar5 != uVar2)) {
      for (; cVar1 = *pcVar10, *pcVar9 = cVar1, cVar1 != '\0'; pcVar10 = pcVar10 + 1) {
        pcVar9 = pcVar9 + 1;
      }
    }
  }
  else {
    uVar8 = 0;
    while( true ) {
      cVar1 = *pcVar10;
      if ((long)cVar1 == 0) break;
      if ((cVar1 < '\0') ||
         (ppuVar3 = __ctype_b_loc(), (*(byte *)((long)*ppuVar3 + (long)cVar1 * 2 + 1) & 0x20) == 0))
      {
        pcVar9 = pcVar10 + (cVar1 == '\\');
        pcVar10 = pcVar9 + 1;
        str[uVar8] = *pcVar9;
      }
      else {
        str[uVar8] = repl_sq;
        pcVar9 = pcVar10 + 1;
        do {
          pcVar10 = pcVar9;
          if (*pcVar10 < '\0') goto LAB_00105b36;
          pcVar9 = pcVar10 + 3;
        } while ((*(byte *)((long)*ppuVar3 + (long)pcVar10[2] * 2 + 1) & 0x20) != 0);
        pcVar10 = pcVar10 + 2;
      }
LAB_00105b36:
      uVar8 = uVar8 + 1;
    }
    str[uVar8 & 0xffffffff] = '\0';
  }
  return str;
}

Assistant:

SXML_CHAR* strip_spaces(SXML_CHAR* str, SXML_CHAR repl_sq)
{
	SXML_CHAR* p;
	int i, len;
	
	/* 'p' to the first non-space */
	for (p = str; *p != NULC && sx_isspace(*p); p++) ; /* No need to search for 'protect' as it is not a space */
	len = sx_strlen(str);
	for (i = len-1; i >= 0 && sx_isspace(str[i]); i--) ;
	if (i >= 0 && str[i] == C2SX('\\')) /* If last non-space is the protection, keep the last space */
		i++;
	str[i+1] = NULC; /* New end of string to last non-space */
	
	if (repl_sq == NULC) {
		if (p == str && i == len)
			return str; /* Nothing to do */
		for (i = 0; (str[i] = *p) != NULC; i++, p++) ; /* Copy 'p' to 'str' */
		return str;
	}
	
	/* Squeeze all spaces with 'repl_sq' */
	i = 0;
	while (*p != NULC) {
		if (sx_isspace(*p)) {
			str[i++] = repl_sq;
			while (sx_isspace(*++p)) ; /* Skips all next spaces */
		} else {
			if (*p == C2SX('\\'))
				p++;
			str[i++] = *p++;
		}
	}
	str[i] = NULC;
	
	return str;
}